

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall
argo::parser::parse_name_value_pair
          (parser *this,lexer *l,unique_ptr<argo::json,_std::default_delete<argo::json>_> *object,
          size_t nesting_depth)

{
  undefined1 auVar1 [8];
  token_type tVar2;
  token *ptVar3;
  string *psVar4;
  json_object *this_00;
  __uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_> *this_01;
  json_parser_exception *pjVar5;
  size_t sVar6;
  pointer *__ptr;
  string name;
  undefined1 local_58 [8];
  key_type local_50;
  
  ptVar3 = lexer::next(l);
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  tVar2 = token::get_type(ptVar3);
  if (tVar2 != string_e) {
    pjVar5 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
    psVar4 = token::get_raw_value_abi_cxx11_(ptVar3);
    sVar6 = reader::get_byte_index(this->m_reader);
    json_parser_exception::json_parser_exception(pjVar5,unexpected_token_e,psVar4,sVar6);
    __cxa_throw(pjVar5,&json_parser_exception::typeinfo,std::exception::~exception);
  }
  if (this->m_convert_strings == true) {
    psVar4 = token::get_raw_value_abi_cxx11_(ptVar3);
    utf8::json_string_to_utf8((utf8 *)local_58,psVar4);
    std::__cxx11::string::_M_assign((string *)&local_50);
    auVar1 = local_58;
    if (local_58 != (undefined1  [8])0x0) {
      if (*(_func_int ***)local_58 != (_func_int **)((long)local_58 + 0x10)) {
        operator_delete(*(_func_int ***)local_58);
      }
      operator_delete((void *)auVar1);
    }
  }
  else {
    token::get_raw_value_abi_cxx11_(ptVar3);
    std::__cxx11::string::_M_assign((string *)&local_50);
  }
  ptVar3 = lexer::next(l);
  tVar2 = token::get_type(ptVar3);
  if (tVar2 == name_separator_e) {
    parse_value((parser *)local_58,(lexer *)this,(size_t)l);
    this_00 = json::get_object_abi_cxx11_
                        ((object->_M_t).
                         super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>._M_t.
                         super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
                         super__Head_base<0UL,_argo::json_*,_false>._M_head_impl);
    this_01 = (__uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_> *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
              ::operator[](this_00,&local_50);
    auVar1 = local_58;
    local_58 = (undefined1  [8])0x0;
    std::__uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>::reset
              (this_01,(pointer)auVar1);
    auVar1 = local_58;
    if (local_58 != (undefined1  [8])0x0) {
      json::~json((json *)local_58);
      operator_delete((void *)auVar1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    return;
  }
  pjVar5 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
  psVar4 = token::get_raw_value_abi_cxx11_(ptVar3);
  sVar6 = reader::get_byte_index(this->m_reader);
  json_parser_exception::json_parser_exception(pjVar5,unexpected_token_e,psVar4,sVar6);
  __cxa_throw(pjVar5,&json_parser_exception::typeinfo,std::exception::~exception);
}

Assistant:

void parser::parse_name_value_pair(lexer &l, unique_ptr<json> &object, size_t nesting_depth)
{
    const token &t1 = l.next();

    string name;

    if (t1.get_type() == token::string_e)
    {
        if (m_convert_strings)
        {
            name = *utf8::json_string_to_utf8(t1.get_raw_value());
        }
        else
        {
            name = t1.get_raw_value();
        }
    }
    else
    {
        throw json_parser_exception(
                        json_parser_exception::unexpected_token_e,
                        t1.get_raw_value(),
                        m_reader.get_byte_index());
    }

    const token &t2 = l.next();

    if (t2.get_type() != token::name_separator_e)
    {
        throw json_parser_exception(
                            json_parser_exception::unexpected_token_e,
                            t2.get_raw_value(),
                            m_reader.get_byte_index());
    }

    object->get_object()[name] = parse_value(l, nesting_depth);
}